

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O2

UINT8 k053260_read(void *chip,UINT8 offset)

{
  int iVar1;
  byte bVar2;
  UINT8 *pUVar3;
  long lVar4;
  k053260_state *info;
  char *pcVar5;
  
  if ((offset & 0x3f) < 2) {
    pUVar3 = (UINT8 *)((long)chip + (ulong)(offset & 0x3f) + 8);
  }
  else {
    if ((offset & 0x3f) != 0x2e) {
      if ((offset & 0x3f) == 0x29) {
        pcVar5 = (char *)((long)chip + 0x23);
        bVar2 = 0;
        for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
          bVar2 = bVar2 | *pcVar5 << ((byte)lVar4 & 0x1f);
          pcVar5 = pcVar5 + 0x28;
        }
        return bVar2;
      }
      return '\0';
    }
    if ((*(byte *)((long)chip + 0xd) & 1) == 0) {
      return '\0';
    }
    iVar1 = *(int *)((long)chip + 0x18);
    *(uint *)((long)chip + 0x18) = iVar1 + 1U & 0xffff;
    pUVar3 = (UINT8 *)((ulong)(*(int *)((long)chip + 0x24) + iVar1 &
                              *(uint *)(*(long *)((long)chip + 0x10) + 0xbc)) +
                      *(long *)(*(long *)((long)chip + 0x10) + 0xb0));
  }
  return *pUVar3;
}

Assistant:

static UINT8 k053260_read(void* chip, UINT8 offset)
{
	k053260_state *info = (k053260_state *)chip;
	UINT8 ret;
	int i;

	offset &= 0x3f;
	ret = 0;

	switch (offset)
	{
		case 0x00: // main-to-sub ports
		case 0x01:
			ret = info->portdata[offset];
			break;

		case 0x29: // voice status
			for (i = 0; i < 4; i++)
				ret |= info->voice[i].playing << i;
			break;

		case 0x2e: // read ROM
			if (info->mode & 1)
				ret = KDSC_read_rom(&info->voice[0]);
			else
				logerror("Attempting to read K053260 ROM without mode bit set\n");
			break;

		default:
			logerror("Read from unknown K053260 register %02x\n", offset);
	}
	return ret;
}